

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.cpp
# Opt level: O2

__pid_t __thiscall Signal::wait(Signal *this,void *__stat_loc)

{
  int64 *__mutex;
  code *pcVar1;
  int iVar2;
  
  __mutex = this->mdata;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) goto LAB_0010a4ab;
  iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Signal.cpp"
                        ,0x3f,"pthread_mutex_lock((pthread_mutex_t*)mdata) == 0");
  do {
    if (iVar2 != 0) {
LAB_0010a4d7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
LAB_0010a4ab:
    do {
      if (this->signaled == true) {
        iVar2 = pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        if ((iVar2 == 0) ||
           (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Signal.cpp"
                                  ,0x44,"pthread_mutex_unlock((pthread_mutex_t*)mdata) == 0"),
           iVar2 == 0)) {
          return (__pid_t)CONCAT71((uint7)(uint3)((uint)iVar2 >> 8),1);
        }
        goto LAB_0010a4d7;
      }
      iVar2 = pthread_cond_wait((pthread_cond_t *)this,(pthread_mutex_t *)__mutex);
    } while (iVar2 == 0);
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Signal.cpp"
                          ,0x47,
                          "pthread_cond_wait((pthread_cond_t*)cdata, (pthread_mutex_t*)mdata) == 0")
    ;
  } while( true );
}

Assistant:

bool Signal::wait()
{
#ifdef _WIN32
  return WaitForSingleObject(handle, INFINITE) == WAIT_OBJECT_0;
#else
  VERIFY(pthread_mutex_lock((pthread_mutex_t*)mdata) == 0);
  for(;;)
  {
    if(signaled)
    {
      VERIFY(pthread_mutex_unlock((pthread_mutex_t*)mdata) == 0);
      return true;
    }
    VERIFY(pthread_cond_wait((pthread_cond_t*)cdata, (pthread_mutex_t*)mdata) == 0);
  }
#endif
}